

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

int __thiscall sentencepiece::SentencePieceProcessor::GetPieceSize(SentencePieceProcessor *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  Die local_29;
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> local_28;
  
  (*this->_vptr_SentencePieceProcessor[7])(&local_28,this);
  util::Status::~Status((Status *)&local_28);
  if (local_28._M_head_impl == (Rep *)0x0) {
    iVar2 = (*((this->model_)._M_t.
               super___uniq_ptr_impl<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::ModelInterface_*,_std::default_delete<sentencepiece::ModelInterface>_>
               .super__Head_base<0UL,_sentencepiece::ModelInterface_*,_false>._M_head_impl)->
              _vptr_ModelInterface[0x10])();
  }
  else {
    iVar1 = logging::GetMinLogLevel();
    iVar2 = 0;
    if (iVar1 < 3) {
      local_29.die_ = false;
      pcVar3 = logging::BaseName("src/sentencepiece_processor.cc");
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3ba);
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"LOG(");
      poVar4 = std::operator<<(poVar4,"ERROR");
      poVar4 = std::operator<<(poVar4,") ");
      (*this->_vptr_SentencePieceProcessor[7])(&local_28,this);
      pcVar3 = util::Status::error_message((Status *)&local_28);
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"\nReturns default value ");
      iVar2 = 0;
      std::ostream::operator<<(poVar4,0);
      util::Status::~Status((Status *)&local_28);
      error::Die::~Die(&local_29);
    }
  }
  return iVar2;
}

Assistant:

int SentencePieceProcessor::GetPieceSize() const {
  CHECK_STATUS_OR_RETURN_DEFAULT(0);
  return model_->GetPieceSize();
}